

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

ssize_t __thiscall
gmlc::networking::TcpConnection::send
          (TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  long lVar4;
  int iVar5;
  allocator<char> local_59;
  void *local_58;
  string local_50;
  
  if ((((this->connected).activated._M_base._M_i & 1U) == 0) ||
     (((this->connectionError)._M_base._M_i & 1U) != 0)) {
    bVar2 = waitUntilConnected(this,(milliseconds)0x12c);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"connection timeout waiting again",&local_59);
      logger(this,0,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar2 = waitUntilConnected(this,(milliseconds)0xc8);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"connection timeout twice, now returning",&local_59);
      logger(this,0,&local_50);
      goto LAB_0036ff9f;
    }
  }
  lVar4 = 0;
  local_58 = __buf;
  iVar5 = 5;
  while (iVar5 != 0) {
    peVar1 = (this->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (**peVar1->_vptr_Socket)(peVar1,CONCAT44(in_register_00000034,__fd) + lVar4,__buf);
    __buf = (void *)((long)__buf - CONCAT44(extraout_var,iVar3));
    if (__buf == (void *)0x0) {
      if (iVar5 != 1) {
        return (ssize_t)local_58;
      }
      break;
    }
    lVar4 = lVar4 + CONCAT44(extraout_var,iVar3);
    iVar5 = iVar5 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"TcpConnection send terminated",&local_59);
  logger(this,0,&local_50);
LAB_0036ff9f:
  std::__cxx11::string::~string((string *)&local_50);
  return 0;
}

Assistant:

size_t TcpConnection::send(const void* buffer, size_t dataLength)
{
    if (!isConnected()) {
        if (!waitUntilConnected(300ms)) {
            logger(0, "connection timeout waiting again");
        }
        if (!waitUntilConnected(200ms)) {
            logger(0, "connection timeout twice, now returning");
            return 0;
        }
    }

    size_t sz{0};
    size_t sent_size{dataLength};
    size_t p{0};
    int count{0};
    while (count++ < 5 &&
           (sz = socket_->write_some(
                reinterpret_cast<const char*>(buffer) + p, sent_size)) !=
               sent_size) {
        sent_size -= sz;
        p += sz;
        //   std::cerr << "DEBUG partial buffer sent" << std::endl;
    }
    if (count >= 5) {
        logger(0, "TcpConnection send terminated");
        return 0;
    }
    return dataLength;

    //  assert(sz == dataLength);
    //  return sz;
}